

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void __thiscall Am_Object_Data::invoke_copy_demons(Am_Object_Data *this)

{
  Am_Object_Demon *pAVar1;
  Am_Object local_20;
  Am_Object_Data *local_18;
  Am_Object_Data *curr_part;
  Am_Object_Data *this_local;
  
  curr_part = this;
  for (local_18 = this->first_part; local_18 != (Am_Object_Data *)0x0;
      local_18 = local_18->next_part) {
    invoke_copy_demons(local_18);
  }
  if (((this->demons_active & 0x8000) != 0) &&
     (this->demon_set->copy_demon != (Am_Object_Demon *)0x0)) {
    Am_Wrapper::Note_Reference(&this->super_Am_Wrapper);
    pAVar1 = this->demon_set->copy_demon;
    Am_Object::Am_Object(&local_20,this);
    (*pAVar1)((Am_Object_Data *)&local_20);
    Am_Object::~Am_Object(&local_20);
  }
  return;
}

Assistant:

void
Am_Object_Data::invoke_copy_demons()
{
  Am_Object_Data *curr_part;
  for (curr_part = first_part; curr_part != nullptr;
       curr_part = curr_part->next_part)
    curr_part->invoke_copy_demons();
  if ((demons_active & DEMONS_ACTIVE) && demon_set->copy_demon) {
    Note_Reference();
    demon_set->copy_demon(Am_Object(this));
  }
}